

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * JSON::stringEscape(string *__return_storage_ptr__,string *str,char ch)

{
  ulong uVar1;
  
  uVar1 = (ulong)(uint)str->_M_string_length;
  while (uVar1 = uVar1 - 1, 0 < (int)uVar1 + 1) {
    if ((str->_M_dataplus)._M_p[uVar1] == ch) {
      std::__cxx11::string::replace((ulong)str,uVar1,(char *)0x0);
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

string stringEscape(string str, char ch) {
        int length = str.size();
        int i = length - 1;
        while (i >= 0) {
            if (str[i] == ch) {
                str.replace(i, 0, "\\");
            }
            i--;
        }
        return str;
    }